

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * QFileDialog::getSaveFileName
                    (QString *__return_storage_ptr__,QWidget *parent,QString *caption,QString *dir,
                    QString *filter,QString *selectedFilter,Options options)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QUrl selectedUrl;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  selectedUrl.d = (QUrlPrivate *)0x0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  QList<QString>::QList<QString,void>((QList<QString> *)&local_58,(QString *)&selectedUrl);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&selectedUrl);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  selectedUrl.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_88);
  getSaveFileUrl((QFileDialog *)&selectedUrl,parent,caption,(QUrl *)&local_88,filter,selectedFilter,
                 options,(QStringList *)&local_58);
  QUrl::~QUrl((QUrl *)&local_88);
  cVar1 = QUrl::isLocalFile();
  if (cVar1 == '\0') {
    cVar1 = QUrl::isEmpty();
    if (cVar1 == '\0') {
      QUrl::toString(__return_storage_ptr__,&selectedUrl,0);
      goto LAB_0049dd02;
    }
  }
  QUrl::toLocalFile();
LAB_0049dd02:
  QUrl::~QUrl(&selectedUrl);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getSaveFileName(QWidget *parent,
                                     const QString &caption,
                                     const QString &dir,
                                     const QString &filter,
                                     QString *selectedFilter,
                                     Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl = getSaveFileUrl(parent, caption, QUrl::fromLocalFile(dir), filter,
                                            selectedFilter, options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}